

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O1

void __thiscall Imf_2_5::TimeCode::setTimeAndFlags(TimeCode *this,uint value,Packing packing)

{
  byte *pbVar1;
  
  if (packing == FILM24_PACKING) {
    value = value & 0xffffff3f;
  }
  else if (packing == TV50_PACKING) {
    this->_time = (value & 0x8000) << 8 | value & 0x3f7f7fbf;
    if ((value >> 0x17 & 1) != 0) {
      pbVar1 = (byte *)((long)&this->_time + 3);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((value >> 0x1e & 1) != 0) {
      pbVar1 = (byte *)((long)&this->_time + 3);
      *pbVar1 = *pbVar1 | 0x40;
    }
    if (-1 < (int)value) {
      return;
    }
    value = this->_time | 0x8000;
  }
  this->_time = value;
  return;
}

Assistant:

void
TimeCode::setTimeAndFlags (unsigned int value, Packing packing)
{
    if (packing == TV50_PACKING)
    {
	_time = value &
		 ~((1 << 6) | (1 << 15) | (1 << 23) | (1 << 30) | (1 << 31));

	if (value & (1 << 15))
	    setBgf0 (true);

	if (value & (1 << 23))
	    setBgf2 (true);

	if (value & (1 << 30))
	    setBgf1 (true);

	if (value & (1 << 31))
	    setFieldPhase (true);
    }
    else if (packing == FILM24_PACKING)
    {
	_time = value & ~((1 << 6) | (1 << 7));
    }
    else // packing == TV60_PACKING
    {
	_time = value;
    }
}